

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluTextureTestUtil.cpp
# Opt level: O2

bool glu::TextureTestUtil::verifyTextureResult
               (TestContext *testCtx,ConstPixelBufferAccess *result,TextureCubeArrayView *src,
               float *texCoord,ReferenceParams *sampleParams,LookupPrecision *lookupPrec,
               IVec4 *coordBits,LodPrecision *lodPrec,PixelFormat *pixelFormat)

{
  ostringstream *this;
  TestLog *this_00;
  int iVar1;
  Surface *pSVar2;
  void *__buf;
  void *__buf_00;
  void *__buf_01;
  void *__buf_02;
  int __fd;
  allocator<char> local_2fc;
  allocator<char> local_2fb;
  allocator<char> local_2fa;
  allocator<char> local_2f9;
  TestLog *local_2f8;
  string local_2f0;
  string local_2d0;
  string local_2b0;
  string local_290;
  Surface reference;
  Surface errorMask;
  LogImage local_240;
  MessageBuilder local_1b0;
  
  local_2f8 = testCtx->m_log;
  tcu::Surface::Surface(&reference,(result->m_size).m_data[0],(result->m_size).m_data[1]);
  tcu::Surface::Surface(&errorMask,(result->m_size).m_data[0],(result->m_size).m_data[1]);
  tcu::SurfaceAccess::SurfaceAccess((SurfaceAccess *)&local_1b0,&reference,pixelFormat);
  sampleTexture((SurfaceAccess *)&local_1b0,src,texCoord,sampleParams);
  tcu::Surface::getAccess((PixelBufferAccess *)&local_1b0,&reference);
  tcu::Surface::getAccess((PixelBufferAccess *)&local_240,&errorMask);
  iVar1 = computeTextureLookupDiff
                    (result,(ConstPixelBufferAccess *)&local_1b0,(PixelBufferAccess *)&local_240,src
                     ,texCoord,sampleParams,lookupPrec,coordBits,lodPrec,testCtx->m_watchDog);
  if (0 < iVar1) {
    this = &local_1b0.m_str;
    local_1b0.m_log = local_2f8;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)this);
    std::operator<<((ostream *)this,"ERROR: Result verification failed, got ");
    std::ostream::operator<<(this,iVar1);
    std::operator<<((ostream *)this," invalid pixels!");
    tcu::MessageBuilder::operator<<(&local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)this);
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_290,"VerifyResult",&local_2f9)
  ;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2b0,"Verification result",&local_2fa);
  this_00 = local_2f8;
  tcu::LogImageSet::LogImageSet((LogImageSet *)&local_240,&local_290,&local_2b0);
  __fd = (int)this_00;
  tcu::LogImageSet::write((LogImageSet *)&local_240,__fd,__buf,(size_t)src);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2d0,"Rendered",&local_2fb);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2f0,"Rendered image",&local_2fc);
  tcu::LogImage::LogImage
            ((LogImage *)&local_1b0,&local_2d0,&local_2f0,result,QP_IMAGE_COMPRESSION_MODE_BEST);
  tcu::LogImage::write((LogImage *)&local_1b0,__fd,__buf_00,(size_t)result);
  tcu::LogImage::~LogImage((LogImage *)&local_1b0);
  std::__cxx11::string::~string((string *)&local_2f0);
  std::__cxx11::string::~string((string *)&local_2d0);
  tcu::LogImageSet::~LogImageSet((LogImageSet *)&local_240);
  std::__cxx11::string::~string((string *)&local_2b0);
  std::__cxx11::string::~string((string *)&local_290);
  if (0 < iVar1) {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_290,"Reference",&local_2f9);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_2b0,"Ideal reference image",&local_2fa);
    pSVar2 = &reference;
    tcu::LogImage::LogImage
              ((LogImage *)&local_1b0,&local_290,&local_2b0,pSVar2,QP_IMAGE_COMPRESSION_MODE_BEST);
    tcu::LogImage::write((LogImage *)&local_1b0,__fd,__buf_01,(size_t)pSVar2);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_2d0,"ErrorMask",&local_2fb);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_2f0,"Error mask",&local_2fc)
    ;
    pSVar2 = &errorMask;
    tcu::LogImage::LogImage(&local_240,&local_2d0,&local_2f0,pSVar2,QP_IMAGE_COMPRESSION_MODE_BEST);
    tcu::LogImage::write(&local_240,__fd,__buf_02,(size_t)pSVar2);
    tcu::LogImage::~LogImage(&local_240);
    std::__cxx11::string::~string((string *)&local_2f0);
    std::__cxx11::string::~string((string *)&local_2d0);
    tcu::LogImage::~LogImage((LogImage *)&local_1b0);
    std::__cxx11::string::~string((string *)&local_2b0);
    std::__cxx11::string::~string((string *)&local_290);
  }
  tcu::TestLog::endImageSet(this_00);
  tcu::Surface::~Surface(&errorMask);
  tcu::Surface::~Surface(&reference);
  return iVar1 == 0;
}

Assistant:

bool verifyTextureResult (tcu::TestContext&						testCtx,
						  const tcu::ConstPixelBufferAccess&	result,
						  const tcu::TextureCubeArrayView&		src,
						  const float*							texCoord,
						  const ReferenceParams&				sampleParams,
						  const tcu::LookupPrecision&			lookupPrec,
						  const tcu::IVec4&						coordBits,
						  const tcu::LodPrecision&				lodPrec,
						  const tcu::PixelFormat&				pixelFormat)
{
	tcu::TestLog&	log				= testCtx.getLog();
	tcu::Surface	reference		(result.getWidth(), result.getHeight());
	tcu::Surface	errorMask		(result.getWidth(), result.getHeight());
	int				numFailedPixels;

	DE_ASSERT(getCompareMask(pixelFormat) == lookupPrec.colorMask);

	sampleTexture(tcu::SurfaceAccess(reference, pixelFormat), src, texCoord, sampleParams);
	numFailedPixels = computeTextureLookupDiff(result, reference.getAccess(), errorMask.getAccess(), src, texCoord, sampleParams, lookupPrec, coordBits, lodPrec, testCtx.getWatchDog());

	if (numFailedPixels > 0)
		log << tcu::TestLog::Message << "ERROR: Result verification failed, got " << numFailedPixels << " invalid pixels!" << tcu::TestLog::EndMessage;

	log << tcu::TestLog::ImageSet("VerifyResult", "Verification result")
		<< tcu::TestLog::Image("Rendered", "Rendered image", result);

	if (numFailedPixels > 0)
	{
		log << tcu::TestLog::Image("Reference", "Ideal reference image", reference)
			<< tcu::TestLog::Image("ErrorMask", "Error mask", errorMask);
	}

	log << tcu::TestLog::EndImageSet;

	return numFailedPixels == 0;
}